

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void update_tick_counts(DUMB_IT_SIGRENDERER *sigrenderer)

{
  long lVar1;
  long lVar2;
  DUMB_IT_SIGRENDERER *in_RDI;
  int i_1;
  IT_CHANNEL *channel;
  int i;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  DUMB_IT_SIGRENDERER *sigrenderer_00;
  int local_c;
  
  local_c = 0;
  do {
    if (0x3f < local_c) {
      return;
    }
    sigrenderer_00 = (DUMB_IT_SIGRENDERER *)(in_RDI->channel + local_c);
    if (sigrenderer_00->field_0x13 == '\0') {
      if ((char)sigrenderer_00->tempo == '\0') {
        if ((*(char *)((long)&sigrenderer_00->tempo + 1) != '\0') &&
           (*(char *)((long)&sigrenderer_00->tempo + 1) =
                 *(char *)((long)&sigrenderer_00->tempo + 1) + -1,
           *(char *)((long)&sigrenderer_00->tempo + 1) == '\0')) {
          process_note_data(sigrenderer_00,
                            (IT_ENTRY *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffdc);
        }
      }
      else {
        *(char *)&sigrenderer_00->tempo = (char)sigrenderer_00->tempo + -1;
        if ((char)sigrenderer_00->tempo == '\0') {
          if ((in_RDI->sigdata->flags & 0x240U) == 0) {
            lVar1._0_1_ = sigrenderer_00->channel[0].lastYspeed;
            lVar1._1_1_ = sigrenderer_00->channel[0].lastYdepth;
            lVar1._2_1_ = sigrenderer_00->channel[0].lastI;
            lVar1._3_1_ = sigrenderer_00->channel[0].lastJ;
            lVar1._4_1_ = sigrenderer_00->channel[0].lastN;
            lVar1._5_1_ = sigrenderer_00->channel[0].lastO;
            lVar1._6_1_ = sigrenderer_00->channel[0].high_offset;
            lVar1._7_1_ = sigrenderer_00->channel[0].lastP;
            if (lVar1 != 0) {
              for (in_stack_ffffffffffffffe4 = 0; in_stack_ffffffffffffffe4 < 0xc0;
                  in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe4 + 1) {
                if (in_RDI->playing[in_stack_ffffffffffffffe4] == (IT_PLAYING *)0x0) {
                  *(undefined1 *)(*(long *)&sigrenderer_00->channel[0].lastYspeed + 0x2b) = 3;
                  in_RDI->playing[in_stack_ffffffffffffffe4] =
                       *(IT_PLAYING **)&sigrenderer_00->channel[0].lastYspeed;
                  sigrenderer_00->channel[0].lastYspeed = '\0';
                  sigrenderer_00->channel[0].lastYdepth = '\0';
                  sigrenderer_00->channel[0].lastI = '\0';
                  sigrenderer_00->channel[0].lastJ = '\0';
                  sigrenderer_00->channel[0].lastN = '\0';
                  sigrenderer_00->channel[0].lastO = '\0';
                  sigrenderer_00->channel[0].high_offset = '\0';
                  sigrenderer_00->channel[0].lastP = '\0';
                  break;
                }
              }
              lVar2._0_1_ = sigrenderer_00->channel[0].lastYspeed;
              lVar2._1_1_ = sigrenderer_00->channel[0].lastYdepth;
              lVar2._2_1_ = sigrenderer_00->channel[0].lastI;
              lVar2._3_1_ = sigrenderer_00->channel[0].lastJ;
              lVar2._4_1_ = sigrenderer_00->channel[0].lastN;
              lVar2._5_1_ = sigrenderer_00->channel[0].lastO;
              lVar2._6_1_ = sigrenderer_00->channel[0].high_offset;
              lVar2._7_1_ = sigrenderer_00->channel[0].lastP;
              if (lVar2 != 0) {
                free_playing(in_RDI,*(IT_PLAYING **)&sigrenderer_00->channel[0].lastYspeed);
                sigrenderer_00->channel[0].lastYspeed = '\0';
                sigrenderer_00->channel[0].lastYdepth = '\0';
                sigrenderer_00->channel[0].lastI = '\0';
                sigrenderer_00->channel[0].lastJ = '\0';
                sigrenderer_00->channel[0].lastN = '\0';
                sigrenderer_00->channel[0].lastO = '\0';
                sigrenderer_00->channel[0].high_offset = '\0';
                sigrenderer_00->channel[0].lastP = '\0';
              }
            }
          }
          else {
            *(undefined1 *)((long)&sigrenderer_00->sigdata + 4) = 0;
          }
        }
      }
    }
    else {
      sigrenderer_00->field_0x13 = sigrenderer_00->field_0x13 + -1;
      if (sigrenderer_00->field_0x13 == '\0') {
        xm_note_off((DUMB_IT_SIGDATA *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                    ,(IT_CHANNEL *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      }
    }
    local_c = local_c + 1;
  } while( true );
}

Assistant:

static void update_tick_counts(DUMB_IT_SIGRENDERER *sigrenderer)
{
	int i;

	for (i = 0; i < DUMB_IT_N_CHANNELS; i++) {
		IT_CHANNEL *channel = &sigrenderer->channel[i];

		if (channel->key_off_count) {
			channel->key_off_count--;
			if (channel->key_off_count == 0)
				xm_note_off(sigrenderer->sigdata, channel);
		} else if (channel->note_cut_count) {
			channel->note_cut_count--;
			if (channel->note_cut_count == 0) {
				if (sigrenderer->sigdata->flags & (IT_WAS_AN_XM | IT_WAS_A_PTM))
					channel->volume = 0;
				else if (channel->playing) {
					int i;
					for (i = 0; i < DUMB_IT_N_NNA_CHANNELS; i++) {
						if (!sigrenderer->playing[i]) {
							channel->playing->declick_stage = 3;
							sigrenderer->playing[i] = channel->playing;
							channel->playing = NULL;
							break;
						}
					}
					if (channel->playing) {
						free_playing(sigrenderer, channel->playing);
						channel->playing = NULL;
					}
				}
			}
		} else if (channel->note_delay_count) {
			channel->note_delay_count--;
			if (channel->note_delay_count == 0)
				process_note_data(sigrenderer, channel->note_delay_entry, 0);
					/* Don't bother checking the return value; if the note
					 * was delayed, there can't have been a speed=0.
					 */
		}
	}
}